

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaTargetGenerator::WriteObjectBuildStatement(cmNinjaTargetGenerator *this,cmSourceFile *source)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGeneratorTarget *pcVar2;
  pointer pSVar3;
  char *pcVar4;
  cmLocalNinjaGenerator *pcVar5;
  cmMakefile *this_00;
  pointer pcVar6;
  cmGeneratedFileStream *os;
  pointer pbVar7;
  pointer pbVar8;
  size_type sVar9;
  pointer pbVar10;
  pointer pbVar11;
  pointer pbVar12;
  pointer pbVar13;
  pointer pbVar14;
  bool bVar15;
  bool bVar16;
  int iVar17;
  int iVar19;
  string *psVar20;
  mapped_type *pmVar21;
  KindedSources *pKVar22;
  long *plVar23;
  char *pcVar24;
  mapped_type *defines;
  mapped_type *includes;
  size_t sVar25;
  MapToNinjaPathImpl MVar26;
  cmCustomCommand *pcVar27;
  cmGlobalNinjaGenerator *pcVar28;
  iterator iVar29;
  mapped_type *this_01;
  cmGlobalNinjaGenerator *pcVar30;
  size_type *psVar31;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar32;
  undefined8 uVar33;
  _Alloc_hider _Var34;
  cmNinjaTargetGenerator *pcVar35;
  string *odi;
  pointer pSVar36;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar37;
  string ppRspFile;
  string rule;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_5;
  string comment;
  string rspfile;
  Names targetNames;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string objectFileName;
  cmNinjaVars vars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_4;
  string language;
  cmNinjaDeps orderOnlyDeps;
  string ppFileName;
  cmNinjaDeps ppOrderOnlyDeps;
  cmNinjaDeps implicitDeps;
  cmNinjaDeps ppImplicitDeps;
  cmNinjaDeps ppExplicitDeps;
  cmNinjaDeps explicitDeps;
  string ppRule;
  string sourceFileName;
  string objectFileDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sourceDirectory;
  cmNinjaDeps ppImplicitOuts;
  cmNinjaDeps ppOutputs;
  key_type local_a8;
  key_type local_88;
  string objectDir;
  cmNinjaDeps outputs;
  uint uVar18;
  
  cmSourceFile::GetLanguage_abi_cxx11_(&language,source);
  iVar17 = std::__cxx11::string::compare((char *)&language);
  if (iVar17 == 0) {
    psVar20 = cmSourceFile::GetFullPath_abi_cxx11_(source);
    sourceFileName._M_dataplus._M_p = (pointer)&sourceFileName.field_2;
    pcVar6 = (psVar20->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sourceFileName,pcVar6,pcVar6 + psVar20->_M_string_length);
  }
  else {
    psVar20 = cmSourceFile::GetFullPath_abi_cxx11_(source);
    ConvertToNinjaPath(&sourceFileName,this,psVar20);
  }
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            (&targetNames.Base,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  ConvertToNinjaPath(&objectDir,this,&targetNames.Base);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
    operator_delete(targetNames.Base._M_dataplus._M_p,
                    targetNames.Base.field_2._M_allocated_capacity + 1);
  }
  GetObjectFilePath_abi_cxx11_(&targetNames.Base,this,source);
  ConvertToNinjaPath(&objectFileName,this,&targetNames.Base);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
    operator_delete(targetNames.Base._M_dataplus._M_p,
                    targetNames.Base.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemTools::GetFilenamePath(&objectFileDir,&objectFileName);
  iVar17 = std::__cxx11::string::compare((char *)&language);
  if ((iVar17 == 0) || (iVar17 = std::__cxx11::string::compare((char *)&language), iVar17 == 0)) {
    uVar18 = 0;
  }
  else {
    bVar15 = ForceResponseFile(this);
    uVar18 = (uint)bVar15;
  }
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ComputeFlagsForObject(&targetNames.Base,this,source,&language);
  paVar32 = &comment.field_2;
  comment._M_dataplus._M_p = (pointer)paVar32;
  std::__cxx11::string::_M_construct<char_const*>((string *)&comment,"FLAGS","");
  pmVar21 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&comment);
  std::__cxx11::string::operator=((string *)pmVar21,(string *)&targetNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment._M_dataplus._M_p != paVar32) {
    operator_delete(comment._M_dataplus._M_p,
                    CONCAT71(comment.field_2._M_allocated_capacity._1_7_,
                             comment.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
    operator_delete(targetNames.Base._M_dataplus._M_p,
                    targetNames.Base.field_2._M_allocated_capacity + 1);
  }
  ComputeDefines(&targetNames.Base,this,source,&language);
  comment._M_dataplus._M_p = (pointer)paVar32;
  std::__cxx11::string::_M_construct<char_const*>((string *)&comment,"DEFINES","");
  pmVar21 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&comment);
  std::__cxx11::string::operator=((string *)pmVar21,(string *)&targetNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment._M_dataplus._M_p != paVar32) {
    operator_delete(comment._M_dataplus._M_p,
                    CONCAT71(comment.field_2._M_allocated_capacity._1_7_,
                             comment.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
    operator_delete(targetNames.Base._M_dataplus._M_p,
                    targetNames.Base.field_2._M_allocated_capacity + 1);
  }
  ComputeIncludes(&targetNames.Base,this,source,&language);
  comment._M_dataplus._M_p = (pointer)paVar32;
  std::__cxx11::string::_M_construct<char_const*>((string *)&comment,"INCLUDES","");
  pmVar21 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&comment);
  std::__cxx11::string::operator=((string *)pmVar21,(string *)&targetNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment._M_dataplus._M_p != paVar32) {
    operator_delete(comment._M_dataplus._M_p,
                    CONCAT71(comment.field_2._M_allocated_capacity._1_7_,
                             comment.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
    operator_delete(targetNames.Base._M_dataplus._M_p,
                    targetNames.Base.field_2._M_allocated_capacity + 1);
  }
  iVar17 = std::__cxx11::string::compare((char *)&language);
  if (iVar17 == 0) {
    comment._M_string_length = 0;
    comment.field_2._M_local_buf[0] = '\0';
    pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    comment._M_dataplus._M_p = (pointer)paVar32;
    psVar20 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_
                        (&this->super_cmCommonTargetGenerator);
    pKVar22 = cmGeneratorTarget::GetKindedSources(pcVar2,psVar20);
    pSVar36 = (pKVar22->Sources).
              super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar3 = (pKVar22->Sources).
             super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar36 != pSVar3) {
      do {
        if ((pSVar36->Source).Value != source) {
          psVar20 = cmSourceFile::GetFullPath_abi_cxx11_((pSVar36->Source).Value);
          ConvertToNinjaPath(&rule,this,psVar20);
          plVar23 = (long *)std::__cxx11::string::replace((ulong)&rule,0,(char *)0x0,0x4adeb1);
          targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
          psVar31 = (size_type *)(plVar23 + 2);
          if ((size_type *)*plVar23 == psVar31) {
            targetNames.Base.field_2._M_allocated_capacity = *psVar31;
            targetNames.Base.field_2._8_8_ = plVar23[3];
          }
          else {
            targetNames.Base.field_2._M_allocated_capacity = *psVar31;
            targetNames.Base._M_dataplus._M_p = (pointer)*plVar23;
          }
          targetNames.Base._M_string_length = plVar23[1];
          *plVar23 = (long)psVar31;
          plVar23[1] = 0;
          *(undefined1 *)(plVar23 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&comment,(ulong)targetNames.Base._M_dataplus._M_p)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
            operator_delete(targetNames.Base._M_dataplus._M_p,
                            targetNames.Base.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)rule._M_dataplus._M_p != &rule.field_2) {
            operator_delete(rule._M_dataplus._M_p,rule.field_2._M_allocated_capacity + 1);
          }
        }
        pSVar36 = pSVar36 + 1;
      } while (pSVar36 != pSVar3);
    }
    targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&targetNames,"SWIFT_AUXILIARY_SOURCES","");
    pmVar21 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&targetNames.Base);
    std::__cxx11::string::_M_assign((string *)pmVar21);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
      operator_delete(targetNames.Base._M_dataplus._M_p,
                      targetNames.Base.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&targetNames,"SWIFT_MODULE_NAME","");
    pcVar24 = cmGeneratorTarget::GetProperty(pcVar2,&targetNames.Base);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
      operator_delete(targetNames.Base._M_dataplus._M_p,
                      targetNames.Base.field_2._M_allocated_capacity + 1);
    }
    if (pcVar24 == (char *)0x0) {
      cmGeneratorTarget::GetName_abi_cxx11_((this->super_cmCommonTargetGenerator).GeneratorTarget);
      targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&targetNames,"SWIFT_MODULE_NAME","")
      ;
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&targetNames.Base);
      std::__cxx11::string::_M_assign((string *)pmVar21);
    }
    else {
      targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&targetNames,"SWIFT_MODULE_NAME","")
      ;
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&targetNames.Base);
      pcVar4 = (char *)pmVar21->_M_string_length;
      strlen(pcVar24);
      std::__cxx11::string::_M_replace((ulong)pmVar21,0,pcVar4,(ulong)pcVar24);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
      operator_delete(targetNames.Base._M_dataplus._M_p,
                      targetNames.Base.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    psVar20 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_
                        (&this->super_cmCommonTargetGenerator);
    cmGeneratorTarget::GetLibraryNames(&targetNames,pcVar2,psVar20);
    paVar32 = &rule.field_2;
    rule._M_dataplus._M_p = (pointer)paVar32;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rule,"SWIFT_LIBRARY_NAME","");
    pmVar21 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&rule);
    std::__cxx11::string::_M_assign((string *)pmVar21);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rule._M_dataplus._M_p != paVar32) {
      operator_delete(rule._M_dataplus._M_p,rule.field_2._M_allocated_capacity + 1);
    }
    rule._M_dataplus._M_p = (pointer)paVar32;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rule,"SWIFT_PARTIAL_MODULE","");
    pcVar24 = cmSourceFile::GetProperty(source,&rule);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rule._M_dataplus._M_p != paVar32) {
      operator_delete(rule._M_dataplus._M_p,rule.field_2._M_allocated_capacity + 1);
    }
    if (pcVar24 == (char *)0x0) {
      rule._M_dataplus._M_p = (pointer)paVar32;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&rule,objectFileName._M_dataplus._M_p,
                 objectFileName._M_dataplus._M_p + objectFileName._M_string_length);
      std::__cxx11::string::append((char *)&rule);
      __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str_2,"SWIFT_PARTIAL_MODULE","");
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&__str_2);
      std::__cxx11::string::operator=((string *)pmVar21,(string *)&rule);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
        operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      rule._M_dataplus._M_p = (pointer)paVar32;
      std::__cxx11::string::_M_construct<char_const*>((string *)&rule,"SWIFT_PARTIAL_MODULE","");
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&rule);
      pcVar4 = (char *)pmVar21->_M_string_length;
      strlen(pcVar24);
      std::__cxx11::string::_M_replace((ulong)pmVar21,0,pcVar4,(ulong)pcVar24);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rule._M_dataplus._M_p != paVar32) {
      operator_delete(rule._M_dataplus._M_p,rule.field_2._M_allocated_capacity + 1);
    }
    rule._M_dataplus._M_p = (pointer)paVar32;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rule,"SWIFT_PARTIAL_DOC","");
    pcVar24 = cmSourceFile::GetProperty(source,&rule);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rule._M_dataplus._M_p != paVar32) {
      operator_delete(rule._M_dataplus._M_p,rule.field_2._M_allocated_capacity + 1);
    }
    if (pcVar24 == (char *)0x0) {
      rule._M_dataplus._M_p = (pointer)paVar32;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&rule,objectFileName._M_dataplus._M_p,
                 objectFileName._M_dataplus._M_p + objectFileName._M_string_length);
      std::__cxx11::string::append((char *)&rule);
      __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str_2,"SWIFT_PARTIAL_DOC","");
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&__str_2);
      std::__cxx11::string::operator=((string *)pmVar21,(string *)&rule);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
        operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      rule._M_dataplus._M_p = (pointer)paVar32;
      std::__cxx11::string::_M_construct<char_const*>((string *)&rule,"SWIFT_PARTIAL_DOC","");
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&rule);
      pcVar4 = (char *)pmVar21->_M_string_length;
      strlen(pcVar24);
      std::__cxx11::string::_M_replace((ulong)pmVar21,0,pcVar4,(ulong)pcVar24);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rule._M_dataplus._M_p != paVar32) {
      operator_delete(rule._M_dataplus._M_p,rule.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.SharedObject._M_dataplus._M_p != &targetNames.SharedObject.field_2) {
      operator_delete(targetNames.SharedObject._M_dataplus._M_p,
                      targetNames.SharedObject.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.PDB._M_dataplus._M_p != &targetNames.PDB.field_2) {
      operator_delete(targetNames.PDB._M_dataplus._M_p,
                      targetNames.PDB.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.ImportLibrary._M_dataplus._M_p != &targetNames.ImportLibrary.field_2) {
      operator_delete(targetNames.ImportLibrary._M_dataplus._M_p,
                      targetNames.ImportLibrary.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.Real._M_dataplus._M_p != &targetNames.Real.field_2) {
      operator_delete(targetNames.Real._M_dataplus._M_p,
                      targetNames.Real.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.Output._M_dataplus._M_p != &targetNames.Output.field_2) {
      operator_delete(targetNames.Output._M_dataplus._M_p,
                      targetNames.Output.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
      operator_delete(targetNames.Base._M_dataplus._M_p,
                      targetNames.Base.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)comment._M_dataplus._M_p != &comment.field_2) {
      operator_delete(comment._M_dataplus._M_p,
                      CONCAT71(comment.field_2._M_allocated_capacity._1_7_,
                               comment.field_2._M_local_buf[0]) + 1);
    }
  }
  paVar32 = &comment.field_2;
  bVar15 = NeedDepTypeMSVC(this,&language);
  if (bVar15) goto LAB_002b3106;
  if (language._M_string_length == 0) {
LAB_002b2cce:
    pcVar5 = this->LocalGenerator;
    comment._M_dataplus._M_p = (pointer)paVar32;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&comment,objectFileName._M_dataplus._M_p,
               objectFileName._M_dataplus._M_p + objectFileName._M_string_length);
    std::__cxx11::string::append((char *)&comment);
    cmOutputConverter::ConvertToOutputFormat
              (&targetNames.Base,
               &(pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&comment,SHELL);
    rule._M_dataplus._M_p = (pointer)&rule.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rule,"DEP_FILE","");
    pmVar21 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&rule);
    std::__cxx11::string::operator=((string *)pmVar21,(string *)&targetNames);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rule._M_dataplus._M_p != &rule.field_2) {
      operator_delete(rule._M_dataplus._M_p,rule.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
      operator_delete(targetNames.Base._M_dataplus._M_p,
                      targetNames.Base.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)comment._M_dataplus._M_p == paVar32) goto LAB_002b3106;
    uVar33 = CONCAT71(comment.field_2._M_allocated_capacity._1_7_,comment.field_2._M_local_buf[0]);
    _Var34._M_p = comment._M_dataplus._M_p;
  }
  else {
    targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&targetNames,"CMAKE_","");
    std::__cxx11::string::_M_append((char *)&targetNames,(ulong)language._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&targetNames);
    bVar15 = cmMakefile::IsOn((this->super_cmCommonTargetGenerator).Makefile,&targetNames.Base);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
      operator_delete(targetNames.Base._M_dataplus._M_p,
                      targetNames.Base.field_2._M_allocated_capacity + 1);
    }
    if (!bVar15) goto LAB_002b2cce;
    cmsys::SystemTools::GetFilenameWithoutLastExtension(&comment,&objectFileName);
    plVar23 = (long *)std::__cxx11::string::append((char *)&comment);
    targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
    psVar31 = (size_type *)(plVar23 + 2);
    if ((size_type *)*plVar23 == psVar31) {
      targetNames.Base.field_2._M_allocated_capacity = *psVar31;
      targetNames.Base.field_2._8_8_ = plVar23[3];
    }
    else {
      targetNames.Base.field_2._M_allocated_capacity = *psVar31;
      targetNames.Base._M_dataplus._M_p = (pointer)*plVar23;
    }
    targetNames.Base._M_string_length = plVar23[1];
    *plVar23 = (long)psVar31;
    plVar23[1] = 0;
    *(undefined1 *)(plVar23 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)comment._M_dataplus._M_p != paVar32) {
      operator_delete(comment._M_dataplus._M_p,
                      CONCAT71(comment.field_2._M_allocated_capacity._1_7_,
                               comment.field_2._M_local_buf[0]) + 1);
    }
    pcVar5 = this->LocalGenerator;
    __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str_2,objectFileDir._M_dataplus._M_p,
               objectFileDir._M_dataplus._M_p + objectFileDir._M_string_length);
    std::__cxx11::string::append((char *)&__str_2);
    plVar23 = (long *)std::__cxx11::string::_M_append
                                ((char *)&__str_2,(ulong)targetNames.Base._M_dataplus._M_p);
    psVar31 = (size_type *)(plVar23 + 2);
    if ((size_type *)*plVar23 == psVar31) {
      rule.field_2._M_allocated_capacity = *psVar31;
      rule.field_2._8_8_ = plVar23[3];
      rule._M_dataplus._M_p = (pointer)&rule.field_2;
    }
    else {
      rule.field_2._M_allocated_capacity = *psVar31;
      rule._M_dataplus._M_p = (pointer)*plVar23;
    }
    rule._M_string_length = plVar23[1];
    *plVar23 = (long)psVar31;
    plVar23[1] = 0;
    *(undefined1 *)(plVar23 + 2) = 0;
    cmOutputConverter::ConvertToOutputFormat
              (&comment,&(pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                         super_cmOutputConverter,&rule,SHELL);
    rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"DEP_FILE","");
    pmVar21 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&rspfile);
    std::__cxx11::string::operator=((string *)pmVar21,(string *)&comment);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
      operator_delete(rspfile._M_dataplus._M_p,
                      CONCAT71(rspfile.field_2._M_allocated_capacity._1_7_,
                               rspfile.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)comment._M_dataplus._M_p != paVar32) {
      operator_delete(comment._M_dataplus._M_p,
                      CONCAT71(comment.field_2._M_allocated_capacity._1_7_,
                               comment.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rule._M_dataplus._M_p != &rule.field_2) {
      operator_delete(rule._M_dataplus._M_p,rule.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
      operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
    }
    uVar33 = targetNames.Base.field_2._M_allocated_capacity;
    _Var34._M_p = targetNames.Base._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.Base._M_dataplus._M_p == &targetNames.Base.field_2) goto LAB_002b3106;
  }
  operator_delete(_Var34._M_p,uVar33 + 1);
LAB_002b3106:
  targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&targetNames,"FLAGS","");
  pmVar21 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&targetNames.Base);
  comment._M_dataplus._M_p = (pointer)paVar32;
  std::__cxx11::string::_M_construct<char_const*>((string *)&comment,"DEFINES","");
  defines = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&comment);
  rule._M_dataplus._M_p = (pointer)&rule.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&rule,"INCLUDES","");
  includes = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&rule);
  ExportObjectCompileCommand
            (this,&language,&sourceFileName,&objectDir,&objectFileName,&objectFileDir,pmVar21,
             defines,includes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rule._M_dataplus._M_p != &rule.field_2) {
    operator_delete(rule._M_dataplus._M_p,rule.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment._M_dataplus._M_p != paVar32) {
    operator_delete(comment._M_dataplus._M_p,
                    CONCAT71(comment.field_2._M_allocated_capacity._1_7_,
                             comment.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
    operator_delete(targetNames.Base._M_dataplus._M_p,
                    targetNames.Base.field_2._M_allocated_capacity + 1);
  }
  comment._M_string_length = 0;
  comment.field_2._M_local_buf[0] = '\0';
  comment._M_dataplus._M_p = (pointer)paVar32;
  LanguageCompilerRule(&rule,this,&language);
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&outputs,&objectFileName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->Objects,&objectFileName);
  explicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  explicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  explicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&explicitDeps,&sourceFileName);
  implicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  implicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  implicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&targetNames,"OBJECT_DEPENDS","");
  pcVar24 = cmSourceFile::GetProperty(source,&targetNames.Base);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
    operator_delete(targetNames.Base._M_dataplus._M_p,
                    targetNames.Base.field_2._M_allocated_capacity + 1);
  }
  if (pcVar24 != (char *)0x0) {
    __str_2._M_dataplus._M_p = (pointer)0x0;
    __str_2._M_string_length = 0;
    __str_2.field_2._M_allocated_capacity = 0;
    targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
    sVar25 = strlen(pcVar24);
    std::__cxx11::string::_M_construct<char_const*>((string *)&targetNames,pcVar24,pcVar24 + sVar25)
    ;
    cmSystemTools::ExpandListArgument
              (&targetNames.Base,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__str_2,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
      operator_delete(targetNames.Base._M_dataplus._M_p,
                      targetNames.Base.field_2._M_allocated_capacity + 1);
    }
    sVar9 = __str_2._M_string_length;
    if (__str_2._M_dataplus._M_p != (pointer)__str_2._M_string_length) {
      _Var34._M_p = __str_2._M_dataplus._M_p;
      do {
        bVar15 = cmsys::SystemTools::FileIsFullPath((string *)_Var34._M_p);
        if (bVar15) {
          cmsys::SystemTools::CollapseFullPath(&targetNames.Base,(string *)_Var34._M_p);
          std::__cxx11::string::operator=((string *)_Var34._M_p,(string *)&targetNames);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
            operator_delete(targetNames.Base._M_dataplus._M_p,
                            targetNames.Base.field_2._M_allocated_capacity + 1);
          }
        }
        _Var34._M_p = _Var34._M_p + 0x20;
      } while (_Var34._M_p != (pointer)sVar9);
    }
    sVar9 = __str_2._M_string_length;
    _Var34._M_p = __str_2._M_dataplus._M_p;
    MVar26.GG = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    std::
    transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )_Var34._M_p,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )sVar9,&implicitDeps,MVar26);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__str_2);
  }
  orderOnlyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  orderOnlyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  orderOnlyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  OrderDependsTargetForTarget_abi_cxx11_(&targetNames.Base,this);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&orderOnlyDeps,
             &targetNames.Base);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
    operator_delete(targetNames.Base._M_dataplus._M_p,
                    targetNames.Base.field_2._M_allocated_capacity + 1);
  }
  bVar15 = source->IsGenerated;
  if (bVar15 == true) {
    __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&__str_2,"__CMAKE_GENERATED_BY_CMAKE","");
    bVar16 = cmSourceFile::GetPropertyAsBool(source,&__str_2);
    if ((bVar16) ||
       (pcVar27 = cmSourceFile::GetCustomCommand(source), pcVar27 != (cmCustomCommand *)0x0)) {
      bVar16 = false;
    }
    else {
      pcVar28 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      iVar29 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&(pcVar28->CustomCommandOutputs)._M_t,&sourceFileName);
      bVar16 = (_Rb_tree_header *)iVar29._M_node ==
               &(pcVar28->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header;
    }
  }
  else {
    bVar16 = false;
  }
  if ((bVar15 != false) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_2._M_dataplus._M_p != &__str_2.field_2)) {
    operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
  }
  if (bVar16) {
    pcVar28 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    cmGlobalNinjaGenerator::AddAssumedSourceDependencies(pcVar28,&sourceFileName,&orderOnlyDeps);
  }
  iVar17 = std::__cxx11::string::compare((char *)&language);
  iVar19 = std::__cxx11::string::compare((char *)&language);
  if (iVar19 == 0) {
    iVar19 = std::__cxx11::string::compare((char *)&language);
    rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
    rspfile._M_string_length = 0;
    rspfile.field_2._M_local_buf[0] = '\0';
    LanguagePreprocessRule(&ppRule,this,&language);
    ppOutputs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ppOutputs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ppOutputs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppImplicitOuts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppImplicitOuts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ppImplicitOuts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ppExplicitDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppExplicitDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ppExplicitDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ppImplicitDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppImplicitDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ppImplicitDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ppOrderOnlyDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppOrderOnlyDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ppOrderOnlyDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    targetNames.Base.field_2._8_8_ = &targetNames.Base._M_string_length;
    targetNames.Base._M_string_length = targetNames.Base._M_string_length & 0xffffffff00000000;
    targetNames.Base.field_2._M_allocated_capacity = 0;
    targetNames.Output._M_string_length = 0;
    targetNames.Output._M_dataplus._M_p = (pointer)targetNames.Base.field_2._8_8_;
    GetPreprocessedFilePath_abi_cxx11_(&ppRspFile,this,source);
    ConvertToNinjaPath(&ppFileName,this,&ppRspFile);
    paVar32 = &ppRspFile.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppRspFile._M_dataplus._M_p != paVar32) {
      operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&ppOutputs,&ppFileName);
    pbVar14 = ppExplicitDeps.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pbVar8 = ppExplicitDeps.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar7 = ppExplicitDeps.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar13 = ppImplicitDeps.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pbVar12 = ppOrderOnlyDeps.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pbVar11 = ppOrderOnlyDeps.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pbVar10 = ppOrderOnlyDeps.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppRspFile._M_dataplus._M_p = (pointer)paVar32;
    if (iVar19 == 0) {
      ppExplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           explicitDeps.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      ppExplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           explicitDeps.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      ppExplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           explicitDeps.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      explicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pbVar7;
      explicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar8;
      explicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar14;
      pbVar7 = implicitDeps.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar8 = implicitDeps.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ppImplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           implicitDeps.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      implicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           ppImplicitDeps.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      implicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           ppImplicitDeps.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      implicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar13;
      ppOrderOnlyDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           orderOnlyDeps.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      ppOrderOnlyDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           orderOnlyDeps.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      ppOrderOnlyDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           orderOnlyDeps.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      orderOnlyDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pbVar10;
      orderOnlyDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar11;
      orderOnlyDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar12;
      ppImplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pbVar7;
      ppImplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&ppRspFile,"IN_ABS","");
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&targetNames,&ppRspFile);
      __str_5._M_dataplus._M_p = (pointer)&__str_5.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str_5,"IN_ABS","");
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&vars,&__str_5);
      std::__cxx11::string::swap((string *)pmVar21);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_5._M_dataplus._M_p != &__str_5.field_2) {
        operator_delete(__str_5._M_dataplus._M_p,__str_5.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ppRspFile._M_dataplus._M_p != paVar32) {
        operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&explicitDeps,&ppFileName);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&ppExplicitDeps,&explicitDeps);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&ppImplicitDeps,&implicitDeps);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&ppOrderOnlyDeps,&orderOnlyDeps);
      std::__cxx11::string::_M_construct<char_const*>((string *)&ppRspFile,"IN_ABS","");
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&vars,&ppRspFile);
      __str_5._M_dataplus._M_p = (pointer)&__str_5.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str_5,"IN_ABS","");
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&targetNames,&__str_5);
      std::__cxx11::string::_M_assign((string *)pmVar21);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_5._M_dataplus._M_p != &__str_5.field_2) {
        operator_delete(__str_5._M_dataplus._M_p,__str_5.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ppRspFile._M_dataplus._M_p != paVar32) {
        operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
      }
    }
    ppRspFile._M_dataplus._M_p = (pointer)paVar32;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ppRspFile,"FLAGS","");
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](&vars,&ppRspFile);
    paVar1 = &__str_5.field_2;
    __str_5._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str_5,"FLAGS","");
    pmVar21 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&targetNames,&__str_5);
    std::__cxx11::string::_M_assign((string *)pmVar21);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_5._M_dataplus._M_p != paVar1) {
      operator_delete(__str_5._M_dataplus._M_p,__str_5.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppRspFile._M_dataplus._M_p != paVar32) {
      operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
    }
    if (iVar19 == 0) {
      this_00 = (this->super_cmCommonTargetGenerator).Makefile;
      std::operator+(&__str_4,"CMAKE_",&language);
      plVar23 = (long *)std::__cxx11::string::append((char *)&__str_4);
      psVar31 = (size_type *)(plVar23 + 2);
      if ((size_type *)*plVar23 == psVar31) {
        __str_5.field_2._M_allocated_capacity = *psVar31;
        __str_5.field_2._8_8_ = plVar23[3];
        __str_5._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        __str_5.field_2._M_allocated_capacity = *psVar31;
        __str_5._M_dataplus._M_p = (pointer)*plVar23;
      }
      __str_5._M_string_length = plVar23[1];
      *plVar23 = (long)psVar31;
      plVar23[1] = 0;
      *(undefined1 *)(plVar23 + 2) = 0;
      psVar20 = cmMakefile::GetSafeDefinition(this_00,&__str_5);
      pcVar6 = (psVar20->_M_dataplus)._M_p;
      ppRspFile._M_dataplus._M_p = (pointer)paVar32;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&ppRspFile,pcVar6,pcVar6 + psVar20->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_5._M_dataplus._M_p != paVar1) {
        operator_delete(__str_5._M_dataplus._M_p,__str_5.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_4._M_dataplus._M_p != &__str_4.field_2) {
        operator_delete(__str_4._M_dataplus._M_p,__str_4.field_2._M_allocated_capacity + 1);
      }
      pcVar5 = this->LocalGenerator;
      __str_5._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str_5,"FLAGS","");
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&__str_5);
      (*(pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
                (pcVar5,pmVar21,&ppRspFile);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_5._M_dataplus._M_p != paVar1) {
        operator_delete(__str_5._M_dataplus._M_p,__str_5.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ppRspFile._M_dataplus._M_p != paVar32) {
        operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
      }
      ppRspFile._M_dataplus._M_p = (pointer)paVar32;
      std::__cxx11::string::_M_construct<char_const*>((string *)&ppRspFile,"DEFINES","");
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&targetNames,&ppRspFile);
      __str_5._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str_5,"DEFINES","");
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&vars,&__str_5);
      std::__cxx11::string::swap((string *)pmVar21);
    }
    else {
      ppRspFile._M_dataplus._M_p = (pointer)paVar32;
      std::__cxx11::string::_M_construct<char_const*>((string *)&ppRspFile,"DEFINES","");
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&vars,&ppRspFile);
      __str_5._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str_5,"DEFINES","");
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&targetNames,&__str_5);
      std::__cxx11::string::_M_assign((string *)pmVar21);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_5._M_dataplus._M_p != paVar1) {
      operator_delete(__str_5._M_dataplus._M_p,__str_5.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppRspFile._M_dataplus._M_p != paVar32) {
      operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
    }
    ppRspFile._M_dataplus._M_p = (pointer)paVar32;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ppRspFile,"INCLUDES","");
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](&vars,&ppRspFile);
    __str_5._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str_5,"INCLUDES","");
    pmVar21 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&targetNames,&__str_5);
    std::__cxx11::string::_M_assign((string *)pmVar21);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_5._M_dataplus._M_p != paVar1) {
      operator_delete(__str_5._M_dataplus._M_p,__str_5.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppRspFile._M_dataplus._M_p != paVar32) {
      operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
    }
    if (iVar19 == 0) {
      sourceDirectory.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      sourceDirectory.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      sourceDirectory.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      psVar20 = cmSourceFile::GetFullPath_abi_cxx11_(source);
      cmsys::SystemTools::GetParentDirectory(&ppRspFile,psVar20);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &sourceDirectory,&ppRspFile);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ppRspFile._M_dataplus._M_p != paVar32) {
        operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
      }
      pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      pcVar5 = this->LocalGenerator;
      psVar20 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_
                          (&this->super_cmCommonTargetGenerator);
      cmLocalGenerator::GetIncludeFlags
                (&ppRspFile,(cmLocalGenerator *)pcVar5,&sourceDirectory,pcVar2,&language,false,false
                 ,psVar20);
      __str_4._M_dataplus._M_p = (pointer)&__str_4.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str_4,ppRspFile._M_dataplus._M_p,
                 ppRspFile._M_dataplus._M_p + ppRspFile._M_string_length);
      std::__cxx11::string::append((char *)&__str_4);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"INCLUDES","");
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&local_88);
      plVar23 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&__str_4,(ulong)(pmVar21->_M_dataplus)._M_p);
      psVar31 = (size_type *)(plVar23 + 2);
      if ((size_type *)*plVar23 == psVar31) {
        __str_5.field_2._M_allocated_capacity = *psVar31;
        __str_5.field_2._8_8_ = plVar23[3];
        __str_5._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        __str_5.field_2._M_allocated_capacity = *psVar31;
        __str_5._M_dataplus._M_p = (pointer)*plVar23;
      }
      __str_5._M_string_length = plVar23[1];
      *plVar23 = (long)psVar31;
      plVar23[1] = 0;
      *(undefined1 *)(plVar23 + 2) = 0;
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"INCLUDES","");
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&local_a8);
      std::__cxx11::string::operator=((string *)pmVar21,(string *)&__str_5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_5._M_dataplus._M_p != paVar1) {
        operator_delete(__str_5._M_dataplus._M_p,__str_5.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_4._M_dataplus._M_p != &__str_4.field_2) {
        operator_delete(__str_4._M_dataplus._M_p,__str_4.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ppRspFile._M_dataplus._M_p != paVar32) {
        operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&sourceDirectory);
    }
    pcVar5 = this->LocalGenerator;
    __str_5._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str_5,objectFileName._M_dataplus._M_p,
               objectFileName._M_dataplus._M_p + objectFileName._M_string_length);
    std::__cxx11::string::append((char *)&__str_5);
    cmOutputConverter::ConvertToOutputFormat
              (&ppRspFile,
               &(pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&__str_5,SHELL);
    __str_4._M_dataplus._M_p = (pointer)&__str_4.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str_4,"DEP_FILE","");
    pmVar21 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&targetNames,&__str_4);
    std::__cxx11::string::operator=((string *)pmVar21,(string *)&ppRspFile);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_4._M_dataplus._M_p != &__str_4.field_2) {
      operator_delete(__str_4._M_dataplus._M_p,__str_4.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppRspFile._M_dataplus._M_p != paVar32) {
      operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_5._M_dataplus._M_p != paVar1) {
      operator_delete(__str_5._M_dataplus._M_p,__str_5.field_2._M_allocated_capacity + 1);
    }
    if (iVar19 == 0) {
      ppRspFile._M_dataplus._M_p = (pointer)paVar32;
      std::__cxx11::string::_M_construct<char_const*>((string *)&ppRspFile,"DEP_FILE","");
      pVar37 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::equal_range(&vars._M_t,&ppRspFile);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_erase_aux(&vars._M_t,(_Base_ptr)pVar37.first._M_node,(_Base_ptr)pVar37.second._M_node);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ppRspFile._M_dataplus._M_p != paVar32) {
        operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
      }
    }
    if (iVar17 == 0) {
      ppRspFile._M_dataplus._M_p = (pointer)paVar32;
      std::__cxx11::string::_M_construct<char_const*>((string *)&ppRspFile,"OBJ_FILE","");
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&targetNames,&ppRspFile);
      std::__cxx11::string::_M_assign((string *)pmVar21);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ppRspFile._M_dataplus._M_p != paVar32) {
        operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
      }
      ppRspFile._M_dataplus._M_p = (pointer)paVar32;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&ppRspFile,objectFileName._M_dataplus._M_p,
                 objectFileName._M_dataplus._M_p + objectFileName._M_string_length);
      std::__cxx11::string::append((char *)&ppRspFile);
      __str_5._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&__str_5,"DYNDEP_INTERMEDIATE_FILE","");
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&targetNames,&__str_5);
      std::__cxx11::string::_M_assign((string *)pmVar21);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_5._M_dataplus._M_p != paVar1) {
        operator_delete(__str_5._M_dataplus._M_p,__str_5.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&ppImplicitOuts,&ppRspFile);
      this_01 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::operator[](&this->DDIFiles,&language);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_01,&ppRspFile);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ppRspFile._M_dataplus._M_p != paVar32) {
        operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar35 = (cmNinjaTargetGenerator *)&ppRspFile;
    ppRspFile._M_dataplus._M_p = (pointer)paVar32;
    std::__cxx11::string::_M_construct<char_const*>((string *)pcVar35,"JOB_POOL_COMPILE","");
    addPoolNinjaVariable
              (pcVar35,&ppRspFile,(this->super_cmCommonTargetGenerator).GeneratorTarget,
               (cmNinjaVars *)&targetNames);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppRspFile._M_dataplus._M_p != paVar32) {
      operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
    }
    ppRspFile._M_dataplus._M_p = (pointer)paVar32;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&ppRspFile,ppFileName._M_dataplus._M_p,
               ppFileName._M_dataplus._M_p + ppFileName._M_string_length);
    std::__cxx11::string::append((char *)&ppRspFile);
    pcVar28 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    pcVar30 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    cmGlobalNinjaGenerator::WriteBuild
              (pcVar28,(ostream *)pcVar30->BuildFileStream,&rspfile,&ppRule,&ppOutputs,
               &ppImplicitOuts,&ppExplicitDeps,&ppImplicitDeps,&ppOrderOnlyDeps,
               (cmNinjaVars *)&targetNames,&ppRspFile,-uVar18,(bool *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppRspFile._M_dataplus._M_p != paVar32) {
      operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppFileName._M_dataplus._M_p != &ppFileName.field_2) {
      operator_delete(ppFileName._M_dataplus._M_p,ppFileName.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&targetNames);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ppOrderOnlyDeps);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ppImplicitDeps);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ppExplicitDeps);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ppImplicitOuts);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ppOutputs);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppRule._M_dataplus._M_p != &ppRule.field_2) {
      operator_delete(ppRule._M_dataplus._M_p,ppRule.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
      operator_delete(rspfile._M_dataplus._M_p,
                      CONCAT71(rspfile.field_2._M_allocated_capacity._1_7_,
                               rspfile.field_2._M_local_buf[0]) + 1);
    }
  }
  if (iVar17 == 0) {
    GetDyndepFilePath(&targetNames.Base,this,&language);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&orderOnlyDeps,&targetNames.Base);
    rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"dyndep","");
    pmVar21 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&rspfile);
    std::__cxx11::string::_M_assign((string *)pmVar21);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
      operator_delete(rspfile._M_dataplus._M_p,
                      CONCAT71(rspfile.field_2._M_allocated_capacity._1_7_,
                               rspfile.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
      operator_delete(targetNames.Base._M_dataplus._M_p,
                      targetNames.Base.field_2._M_allocated_capacity + 1);
    }
  }
  EnsureParentDirectoryExists(this,&objectFileName);
  cmOutputConverter::ConvertToOutputFormat
            (&targetNames.Base,
             &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
              super_cmOutputConverter,&objectDir,SHELL);
  paVar32 = &rspfile.field_2;
  rspfile._M_dataplus._M_p = (pointer)paVar32;
  std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"OBJECT_DIR","");
  pmVar21 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&rspfile);
  std::__cxx11::string::operator=((string *)pmVar21,(string *)&targetNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != paVar32) {
    operator_delete(rspfile._M_dataplus._M_p,
                    CONCAT71(rspfile.field_2._M_allocated_capacity._1_7_,
                             rspfile.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
    operator_delete(targetNames.Base._M_dataplus._M_p,
                    targetNames.Base.field_2._M_allocated_capacity + 1);
  }
  cmOutputConverter::ConvertToOutputFormat
            (&targetNames.Base,
             &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
              super_cmOutputConverter,&objectFileDir,SHELL);
  rspfile._M_dataplus._M_p = (pointer)paVar32;
  std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"OBJECT_FILE_DIR","");
  pmVar21 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&rspfile);
  std::__cxx11::string::operator=((string *)pmVar21,(string *)&targetNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != paVar32) {
    operator_delete(rspfile._M_dataplus._M_p,
                    CONCAT71(rspfile.field_2._M_allocated_capacity._1_7_,
                             rspfile.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
    operator_delete(targetNames.Base._M_dataplus._M_p,
                    targetNames.Base.field_2._M_allocated_capacity + 1);
  }
  pcVar35 = (cmNinjaTargetGenerator *)&targetNames;
  targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)pcVar35,"JOB_POOL_COMPILE","");
  addPoolNinjaVariable
            (pcVar35,&targetNames.Base,(this->super_cmCommonTargetGenerator).GeneratorTarget,&vars);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
    operator_delete(targetNames.Base._M_dataplus._M_p,
                    targetNames.Base.field_2._M_allocated_capacity + 1);
  }
  SetMsvcTargetPdbVariable(this,&vars);
  rspfile._M_dataplus._M_p = (pointer)paVar32;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&rspfile,objectFileName._M_dataplus._M_p,
             objectFileName._M_dataplus._M_p + objectFileName._M_string_length);
  std::__cxx11::string::append((char *)&rspfile);
  pcVar28 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  pcVar30 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  targetNames.Base.field_2._M_allocated_capacity = 0;
  targetNames.Base._M_dataplus._M_p = (pointer)0x0;
  targetNames.Base._M_string_length = 0;
  cmGlobalNinjaGenerator::WriteBuild
            (pcVar28,(ostream *)pcVar30->BuildFileStream,&comment,&rule,&outputs,
             (cmNinjaDeps *)&targetNames,&explicitDeps,&implicitDeps,&orderOnlyDeps,&vars,&rspfile,
             -uVar18,(bool *)0x0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&targetNames);
  targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&targetNames,"OBJECT_OUTPUTS","");
  pcVar24 = cmSourceFile::GetProperty(source,&targetNames.Base);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
    operator_delete(targetNames.Base._M_dataplus._M_p,
                    targetNames.Base.field_2._M_allocated_capacity + 1);
  }
  if (pcVar24 != (char *)0x0) {
    ppFileName._M_dataplus._M_p = (pointer)0x0;
    ppFileName._M_string_length = 0;
    ppFileName.field_2._M_allocated_capacity = 0;
    targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
    sVar25 = strlen(pcVar24);
    std::__cxx11::string::_M_construct<char_const*>((string *)&targetNames,pcVar24,pcVar24 + sVar25)
    ;
    cmSystemTools::ExpandListArgument
              (&targetNames.Base,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&ppFileName,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
      operator_delete(targetNames.Base._M_dataplus._M_p,
                      targetNames.Base.field_2._M_allocated_capacity + 1);
    }
    sVar9 = ppFileName._M_string_length;
    _Var34._M_p = ppFileName._M_dataplus._M_p;
    MVar26.GG = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    std::
    transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )_Var34._M_p,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )sVar9,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )_Var34._M_p,MVar26);
    pcVar28 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    pcVar30 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    os = pcVar30->BuildFileStream;
    ppRule._M_dataplus._M_p = (pointer)&ppRule.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ppRule,"Additional output files.","")
    ;
    ppRspFile._M_dataplus._M_p = (pointer)0x0;
    ppRspFile._M_string_length = 0;
    ppRspFile.field_2._M_allocated_capacity = 0;
    __str_5.field_2._M_allocated_capacity = 0;
    __str_5._M_dataplus._M_p = (pointer)0x0;
    __str_5._M_string_length = 0;
    targetNames.Base.field_2._8_8_ = &targetNames.Base._M_string_length;
    targetNames.Base.field_2._M_allocated_capacity = 0;
    targetNames.Base._M_dataplus._M_p = (pointer)0x0;
    targetNames.Base._M_string_length = 0;
    targetNames.Output._M_string_length = 0;
    targetNames.Output._M_dataplus._M_p = (pointer)targetNames.Base.field_2._8_8_;
    cmGlobalNinjaGenerator::WritePhonyBuild
              (pcVar28,(ostream *)os,&ppRule,(cmNinjaDeps *)&ppFileName,&outputs,
               (cmNinjaDeps *)&ppRspFile,(cmNinjaDeps *)&__str_5,(cmNinjaVars *)&targetNames);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&targetNames);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__str_5);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&ppRspFile);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppRule._M_dataplus._M_p != &ppRule.field_2) {
      operator_delete(ppRule._M_dataplus._M_p,ppRule.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&ppFileName);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
    operator_delete(rspfile._M_dataplus._M_p,
                    CONCAT71(rspfile.field_2._M_allocated_capacity._1_7_,
                             rspfile.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&orderOnlyDeps);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&implicitDeps);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&explicitDeps);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&outputs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rule._M_dataplus._M_p != &rule.field_2) {
    operator_delete(rule._M_dataplus._M_p,rule.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment._M_dataplus._M_p != &comment.field_2) {
    operator_delete(comment._M_dataplus._M_p,
                    CONCAT71(comment.field_2._M_allocated_capacity._1_7_,
                             comment.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objectFileDir._M_dataplus._M_p != &objectFileDir.field_2) {
    operator_delete(objectFileDir._M_dataplus._M_p,objectFileDir.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objectFileName._M_dataplus._M_p != &objectFileName.field_2) {
    operator_delete(objectFileName._M_dataplus._M_p,objectFileName.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objectDir._M_dataplus._M_p != &objectDir.field_2) {
    operator_delete(objectDir._M_dataplus._M_p,objectDir.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sourceFileName._M_dataplus._M_p != &sourceFileName.field_2) {
    operator_delete(sourceFileName._M_dataplus._M_p,sourceFileName.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)language._M_dataplus._M_p != &language.field_2) {
    operator_delete(language._M_dataplus._M_p,language.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteObjectBuildStatement(
  cmSourceFile const* source)
{
  std::string const language = source->GetLanguage();
  std::string const sourceFileName =
    language == "RC" ? source->GetFullPath() : this->GetSourceFilePath(source);
  std::string const objectDir =
    this->ConvertToNinjaPath(this->GeneratorTarget->GetSupportDirectory());
  std::string const objectFileName =
    this->ConvertToNinjaPath(this->GetObjectFilePath(source));
  std::string const objectFileDir =
    cmSystemTools::GetFilenamePath(objectFileName);

  bool const lang_supports_response =
    !(language == "RC" || language == "CUDA");
  int const commandLineLengthLimit =
    ((lang_supports_response && this->ForceResponseFile())) ? -1 : 0;

  cmNinjaVars vars;
  vars["FLAGS"] = this->ComputeFlagsForObject(source, language);
  vars["DEFINES"] = this->ComputeDefines(source, language);
  vars["INCLUDES"] = this->ComputeIncludes(source, language);
  if (language == "Swift") {
    // The swift compiler needs all the sources besides the one being compiled
    // in order to do the type checking.  List all these "auxiliary" sources.
    std::string aux_sources;
    cmGeneratorTarget::KindedSources const& sources =
      this->GeneratorTarget->GetKindedSources(this->GetConfigName());
    for (cmGeneratorTarget::SourceAndKind const& src : sources.Sources) {
      if (src.Source.Value == source) {
        continue;
      }
      aux_sources += " " + this->GetSourceFilePath(src.Source.Value);
    }
    vars["SWIFT_AUXILIARY_SOURCES"] = aux_sources;

    if (const char* name =
          this->GeneratorTarget->GetProperty("SWIFT_MODULE_NAME")) {
      vars["SWIFT_MODULE_NAME"] = name;
    } else {
      vars["SWIFT_MODULE_NAME"] = this->GeneratorTarget->GetName();
    }

    cmGeneratorTarget::Names targetNames =
      this->GeneratorTarget->GetLibraryNames(this->GetConfigName());
    vars["SWIFT_LIBRARY_NAME"] = targetNames.Base;

    if (const char* partial = source->GetProperty("SWIFT_PARTIAL_MODULE")) {
      vars["SWIFT_PARTIAL_MODULE"] = partial;
    } else {
      vars["SWIFT_PARTIAL_MODULE"] = objectFileName + ".swiftmodule";
    }

    if (const char* partial = source->GetProperty("SWIFT_PARTIAL_DOC")) {
      vars["SWIFT_PARTIAL_DOC"] = partial;
    } else {
      vars["SWIFT_PARTIAL_DOC"] = objectFileName + ".swiftdoc";
    }
  }

  if (!this->NeedDepTypeMSVC(language)) {
    bool replaceExt(false);
    if (!language.empty()) {
      std::string repVar = "CMAKE_";
      repVar += language;
      repVar += "_DEPFILE_EXTENSION_REPLACE";
      replaceExt = this->Makefile->IsOn(repVar);
    }
    if (!replaceExt) {
      // use original code
      vars["DEP_FILE"] = this->GetLocalGenerator()->ConvertToOutputFormat(
        objectFileName + ".d", cmOutputConverter::SHELL);
    } else {
      // Replace the original source file extension with the
      // depend file extension.
      std::string dependFileName =
        cmSystemTools::GetFilenameWithoutLastExtension(objectFileName) + ".d";
      vars["DEP_FILE"] = this->GetLocalGenerator()->ConvertToOutputFormat(
        objectFileDir + "/" + dependFileName, cmOutputConverter::SHELL);
    }
  }

  this->ExportObjectCompileCommand(
    language, sourceFileName, objectDir, objectFileName, objectFileDir,
    vars["FLAGS"], vars["DEFINES"], vars["INCLUDES"]);

  std::string comment;
  std::string rule = this->LanguageCompilerRule(language);

  cmNinjaDeps outputs;
  outputs.push_back(objectFileName);
  // Add this object to the list of object files.
  this->Objects.push_back(objectFileName);

  cmNinjaDeps explicitDeps;
  explicitDeps.push_back(sourceFileName);

  cmNinjaDeps implicitDeps;
  if (const char* objectDeps = source->GetProperty("OBJECT_DEPENDS")) {
    std::vector<std::string> depList;
    cmSystemTools::ExpandListArgument(objectDeps, depList);
    for (std::string& odi : depList) {
      if (cmSystemTools::FileIsFullPath(odi)) {
        odi = cmSystemTools::CollapseFullPath(odi);
      }
    }
    std::transform(depList.begin(), depList.end(),
                   std::back_inserter(implicitDeps), MapToNinjaPath());
  }

  cmNinjaDeps orderOnlyDeps;
  orderOnlyDeps.push_back(this->OrderDependsTargetForTarget());

  // If the source file is GENERATED and does not have a custom command
  // (either attached to this source file or another one), assume that one of
  // the target dependencies, OBJECT_DEPENDS or header file custom commands
  // will rebuild the file.
  if (source->GetIsGenerated() &&
      !source->GetPropertyAsBool("__CMAKE_GENERATED_BY_CMAKE") &&
      !source->GetCustomCommand() &&
      !this->GetGlobalGenerator()->HasCustomCommandOutput(sourceFileName)) {
    this->GetGlobalGenerator()->AddAssumedSourceDependencies(sourceFileName,
                                                             orderOnlyDeps);
  }

  // For some cases we need to generate a ninja dyndep file.
  bool const needDyndep = this->NeedDyndep(language);

  // For some cases we do an explicit preprocessor invocation.
  bool const explicitPP = this->NeedExplicitPreprocessing(language);
  if (explicitPP) {
    bool const compilePP = this->UsePreprocessedSource(language);
    std::string const ppComment;
    std::string const ppRule = this->LanguagePreprocessRule(language);
    cmNinjaDeps ppOutputs;
    cmNinjaDeps ppImplicitOuts;
    cmNinjaDeps ppExplicitDeps;
    cmNinjaDeps ppImplicitDeps;
    cmNinjaDeps ppOrderOnlyDeps;
    cmNinjaVars ppVars;

    std::string const ppFileName =
      this->ConvertToNinjaPath(this->GetPreprocessedFilePath(source));
    ppOutputs.push_back(ppFileName);

    if (compilePP) {
      // Move compilation dependencies to the preprocessing build statement.
      std::swap(ppExplicitDeps, explicitDeps);
      std::swap(ppImplicitDeps, implicitDeps);
      std::swap(ppOrderOnlyDeps, orderOnlyDeps);
      std::swap(ppVars["IN_ABS"], vars["IN_ABS"]);

      // The actual compilation will now use the preprocessed source.
      explicitDeps.push_back(ppFileName);
    } else {
      // Copy compilation dependencies to the preprocessing build statement.
      ppExplicitDeps = explicitDeps;
      ppImplicitDeps = implicitDeps;
      ppOrderOnlyDeps = orderOnlyDeps;
      ppVars["IN_ABS"] = vars["IN_ABS"];
    }

    // Preprocessing and compilation generally use the same flags.
    ppVars["FLAGS"] = vars["FLAGS"];

    if (compilePP) {
      // In case compilation requires flags that are incompatible with
      // preprocessing, include them here.
      std::string const postFlag = this->Makefile->GetSafeDefinition(
        "CMAKE_" + language + "_POSTPROCESS_FLAG");
      this->LocalGenerator->AppendFlags(vars["FLAGS"], postFlag);
    }

    if (compilePP) {
      // Move preprocessor definitions to the preprocessor build statement.
      std::swap(ppVars["DEFINES"], vars["DEFINES"]);
    } else {
      // Copy preprocessor definitions to the preprocessor build statement.
      ppVars["DEFINES"] = vars["DEFINES"];
    }

    // Copy include directories to the preprocessor build statement.  The
    // Fortran compilation build statement still needs them for the INCLUDE
    // directive.
    ppVars["INCLUDES"] = vars["INCLUDES"];

    if (compilePP) {
      // Prepend source file's original directory as an include directory
      // so e.g. Fortran INCLUDE statements can look for files in it.
      std::vector<std::string> sourceDirectory;
      sourceDirectory.push_back(
        cmSystemTools::GetParentDirectory(source->GetFullPath()));

      std::string sourceDirectoryFlag = this->LocalGenerator->GetIncludeFlags(
        sourceDirectory, this->GeneratorTarget, language, false, false,
        this->GetConfigName());

      vars["INCLUDES"] = sourceDirectoryFlag + " " + vars["INCLUDES"];
    }

    // Explicit preprocessing always uses a depfile.
    ppVars["DEP_FILE"] = this->GetLocalGenerator()->ConvertToOutputFormat(
      objectFileName + ".pp.d", cmOutputConverter::SHELL);
    if (compilePP) {
      // The actual compilation does not need a depfile because it
      // depends on the already-preprocessed source.
      vars.erase("DEP_FILE");
    }

    if (needDyndep) {
      // Tell dependency scanner the object file that will result from
      // compiling the source.
      ppVars["OBJ_FILE"] = objectFileName;

      // Tell dependency scanner where to store dyndep intermediate results.
      std::string const ddiFile = objectFileName + ".ddi";
      ppVars["DYNDEP_INTERMEDIATE_FILE"] = ddiFile;
      ppImplicitOuts.push_back(ddiFile);
      this->DDIFiles[language].push_back(ddiFile);
    }

    this->addPoolNinjaVariable("JOB_POOL_COMPILE", this->GetGeneratorTarget(),
                               ppVars);

    std::string const ppRspFile = ppFileName + ".rsp";

    this->GetGlobalGenerator()->WriteBuild(
      this->GetBuildFileStream(), ppComment, ppRule, ppOutputs, ppImplicitOuts,
      ppExplicitDeps, ppImplicitDeps, ppOrderOnlyDeps, ppVars, ppRspFile,
      commandLineLengthLimit);
  }
  if (needDyndep) {
    std::string const dyndep = this->GetDyndepFilePath(language);
    orderOnlyDeps.push_back(dyndep);
    vars["dyndep"] = dyndep;
  }

  EnsureParentDirectoryExists(objectFileName);

  vars["OBJECT_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    objectDir, cmOutputConverter::SHELL);
  vars["OBJECT_FILE_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    objectFileDir, cmOutputConverter::SHELL);

  this->addPoolNinjaVariable("JOB_POOL_COMPILE", this->GetGeneratorTarget(),
                             vars);

  this->SetMsvcTargetPdbVariable(vars);

  std::string const rspfile = objectFileName + ".rsp";

  this->GetGlobalGenerator()->WriteBuild(
    this->GetBuildFileStream(), comment, rule, outputs,
    /*implicitOuts=*/cmNinjaDeps(), explicitDeps, implicitDeps, orderOnlyDeps,
    vars, rspfile, commandLineLengthLimit);

  if (const char* objectOutputs = source->GetProperty("OBJECT_OUTPUTS")) {
    std::vector<std::string> outputList;
    cmSystemTools::ExpandListArgument(objectOutputs, outputList);
    std::transform(outputList.begin(), outputList.end(), outputList.begin(),
                   MapToNinjaPath());
    this->GetGlobalGenerator()->WritePhonyBuild(this->GetBuildFileStream(),
                                                "Additional output files.",
                                                outputList, outputs);
  }
}